

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_write.c
# Opt level: O1

int TIFFWriteCheck(TIFF *tif,int tiles,char *module)

{
  uint uVar1;
  int iVar2;
  tmsize_t tVar3;
  char *pcVar4;
  
  if (tif->tif_mode == 0) {
    pcVar4 = "File not open for writing";
  }
  else if ((tif->tif_flags >> 10 & 1) == tiles) {
    _TIFFFillStriles(tif);
    if (((tif->tif_dir).td_fieldsset[0] & 2) != 0) {
      if (((tif->tif_dir).td_stripoffset_p == (uint64_t *)0x0) &&
         (iVar2 = TIFFSetupStrips(tif), iVar2 == 0)) {
        (tif->tif_dir).td_nstrips = 0;
        pcVar4 = "tile";
        if ((tif->tif_flags >> 10 & 1) == 0) {
          pcVar4 = "strip";
        }
        TIFFErrorExtR(tif,module,"No space for %s arrays",pcVar4);
        return 0;
      }
      if ((tif->tif_flags & 0x400) == 0) {
        tif->tif_tilesize = -1;
      }
      else {
        tVar3 = TIFFTileSize(tif);
        tif->tif_tilesize = tVar3;
        if (tVar3 == 0) {
          return 0;
        }
      }
      tVar3 = TIFFScanlineSize(tif);
      tif->tif_scanlinesize = tVar3;
      if (tVar3 == 0) {
        return 0;
      }
      uVar1 = tif->tif_flags;
      tif->tif_flags = uVar1 | 0x40;
      if ((tif->tif_dir).td_stripoffset_entry.tdir_tag == 0) {
        return 1;
      }
      if ((tif->tif_dir).td_stripoffset_entry.tdir_count != 0) {
        return 1;
      }
      if ((tif->tif_dir).td_stripoffset_entry.tdir_type != 0) {
        return 1;
      }
      if ((tif->tif_dir).td_stripoffset_entry.tdir_offset.toff_long8 == 0) {
        if ((tif->tif_dir).td_stripbytecount_entry.tdir_tag == 0) {
          return 1;
        }
        if ((tif->tif_dir).td_stripbytecount_entry.tdir_count != 0) {
          return 1;
        }
        if ((tif->tif_dir).td_stripbytecount_entry.tdir_type != 0) {
          return 1;
        }
        if ((uVar1 & 8) == 0 && (tif->tif_dir).td_stripbytecount_entry.tdir_offset.toff_long8 == 0)
        {
          TIFFForceStrileArrayWriting(tif);
          return 1;
        }
        return 1;
      }
      return 1;
    }
    pcVar4 = "Must set \"ImageWidth\" before writing data";
  }
  else {
    pcVar4 = "Can not write tiles to a striped image";
    if (tiles == 0) {
      pcVar4 = "Can not write scanlines to a tiled image";
    }
  }
  TIFFErrorExtR(tif,module,pcVar4);
  return 0;
}

Assistant:

int TIFFWriteCheck(TIFF *tif, int tiles, const char *module)
{
    if (tif->tif_mode == O_RDONLY)
    {
        TIFFErrorExtR(tif, module, "File not open for writing");
        return (0);
    }
    if (tiles ^ isTiled(tif))
    {
        TIFFErrorExtR(tif, module,
                      tiles ? "Can not write tiles to a striped image"
                            : "Can not write scanlines to a tiled image");
        return (0);
    }

    _TIFFFillStriles(tif);

    /*
     * On the first write verify all the required information
     * has been setup and initialize any data structures that
     * had to wait until directory information was set.
     * Note that a lot of our work is assumed to remain valid
     * because we disallow any of the important parameters
     * from changing after we start writing (i.e. once
     * TIFF_BEENWRITING is set, TIFFSetField will only allow
     * the image's length to be changed).
     */
    if (!TIFFFieldSet(tif, FIELD_IMAGEDIMENSIONS))
    {
        TIFFErrorExtR(tif, module,
                      "Must set \"ImageWidth\" before writing data");
        return (0);
    }
    if (tif->tif_dir.td_stripoffset_p == NULL && !TIFFSetupStrips(tif))
    {
        tif->tif_dir.td_nstrips = 0;
        TIFFErrorExtR(tif, module, "No space for %s arrays",
                      isTiled(tif) ? "tile" : "strip");
        return (0);
    }
    if (isTiled(tif))
    {
        tif->tif_tilesize = TIFFTileSize(tif);
        if (tif->tif_tilesize == 0)
            return (0);
    }
    else
        tif->tif_tilesize = (tmsize_t)(-1);
    tif->tif_scanlinesize = TIFFScanlineSize(tif);
    if (tif->tif_scanlinesize == 0)
        return (0);
    tif->tif_flags |= TIFF_BEENWRITING;

    if (tif->tif_dir.td_stripoffset_entry.tdir_tag != 0 &&
        tif->tif_dir.td_stripoffset_entry.tdir_count == 0 &&
        tif->tif_dir.td_stripoffset_entry.tdir_type == 0 &&
        tif->tif_dir.td_stripoffset_entry.tdir_offset.toff_long8 == 0 &&
        tif->tif_dir.td_stripbytecount_entry.tdir_tag != 0 &&
        tif->tif_dir.td_stripbytecount_entry.tdir_count == 0 &&
        tif->tif_dir.td_stripbytecount_entry.tdir_type == 0 &&
        tif->tif_dir.td_stripbytecount_entry.tdir_offset.toff_long8 == 0 &&
        !(tif->tif_flags & TIFF_DIRTYDIRECT))
    {
        TIFFForceStrileArrayWriting(tif);
    }

    return (1);
}